

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  ~DescriptorProto(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  SharedDtor();
}